

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitTableGet(PrintExpressionContents *this,TableGet *curr)

{
  ostream *o;
  string_view local_28;
  TableGet *local_18;
  TableGet *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (TableGet *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"table.get ");
  printMedium(o,local_28);
  wasm::Name::print(&local_18->table,this->o);
  return;
}

Assistant:

void visitTableGet(TableGet* curr) {
    printMedium(o, "table.get ");
    curr->table.print(o);
  }